

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::CreateSerialTestCostList(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *p_Var1;
  TestList *this_00;
  pointer piVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  pointer piVar5;
  int *piVar6;
  int test;
  int testDependency;
  TestList dependencies;
  TestList presortedList;
  TestSet alreadySortedTests;
  int local_c0;
  key_type local_bc;
  _Vector_base<int,_std::allocator<int>_> local_b8;
  _Vector_base<int,_std::allocator<int>_> local_98;
  cmCTestMultiProcessHandler *local_78;
  int *local_70;
  int *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  for (p_Var3 = (this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 !=
      &(this->Tests).
       super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_98,(value_type_conflict2 *)(p_Var3 + 1));
  }
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_98._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_98._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<TestComparator>)this);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = local_98._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->SortedTests;
  piVar6 = local_98._M_impl.super__Vector_impl_data._M_start;
  local_78 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; piVar6 != local_68; piVar6 = piVar6 + 1) {
    local_c0 = *piVar6;
    iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&local_60,&local_c0);
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
      local_b8._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
      local_b8._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
      local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70 = piVar6;
      GetAllTestDependencies(this,local_c0,(TestList *)&local_b8);
      piVar2 = local_b8._M_impl.super__Vector_impl_data._M_finish;
      for (piVar5 = local_b8._M_impl.super__Vector_impl_data._M_start; piVar5 != piVar2;
          piVar5 = piVar5 + 1) {
        local_bc = *piVar5;
        iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                find(&local_60,&local_bc);
        if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,&local_bc);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this_00->super_vector<int,_std::allocator<int>_>,&local_bc);
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,&local_c0);
      std::vector<int,_std::allocator<int>_>::push_back
                (&this_00->super_vector<int,_std::allocator<int>_>,&local_c0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
      this = local_78;
      piVar6 = local_70;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateSerialTestCostList()
{
  TestList presortedList;

  for (auto const& i : this->Tests) {
    presortedList.push_back(i.first);
  }

  std::stable_sort(presortedList.begin(), presortedList.end(),
                   TestComparator(this));

  TestSet alreadySortedTests;

  for (int test : presortedList) {
    if (alreadySortedTests.find(test) != alreadySortedTests.end()) {
      continue;
    }

    TestList dependencies;
    GetAllTestDependencies(test, dependencies);

    for (int testDependency : dependencies) {
      if (alreadySortedTests.find(testDependency) ==
          alreadySortedTests.end()) {
        alreadySortedTests.insert(testDependency);
        this->SortedTests.push_back(testDependency);
      }
    }

    alreadySortedTests.insert(test);
    this->SortedTests.push_back(test);
  }
}